

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O0

void __thiscall ModbusAnalyzer::SetupResults(ModbusAnalyzer *this)

{
  ModbusAnalyzerResults *this_00;
  element_type *settings;
  element_type *peVar1;
  ModbusAnalyzer *this_local;
  
  this_00 = (ModbusAnalyzerResults *)operator_new(0x20);
  settings = std::auto_ptr<ModbusAnalyzerSettings>::get(&this->mSettings);
  ModbusAnalyzerResults::ModbusAnalyzerResults(this_00,this,settings);
  std::auto_ptr<ModbusAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<ModbusAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<ModbusAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<ModbusAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void ModbusAnalyzer::SetupResults()
{
    // Unlike the worker thread, this function is called from the GUI thread
    // we need to reset the Results object here because it is exposed for direct access by the GUI, and it can't be deleted from the
    // WorkerThread

    mResults.reset( new ModbusAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}